

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::ForceConstraintPS::ForceConstraintPS
          (ForceConstraintPS *this,SPxLPBase<double> *lp,int _i,bool lhsFixed,
          DataArray<bool> *fixCols,Array<double> *lo,Array<double> *up,
          shared_ptr<soplex::Tolerances> *tols)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  VectorBase<double> *pVVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar3 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  iVar1 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar2 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_0069e680;
  (this->super_PostStep).m_name = "ForceConstraint";
  (this->super_PostStep).nCols = iVar2;
  (this->super_PostStep).nRows = iVar1;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_38);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__ForceConstraintPS_0069ea28;
  this->m_i = _i;
  this->m_old_i = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum + -1;
  pVVar4 = &(lp->super_LPRowSetBase<double>).right;
  if (lhsFixed) {
    pVVar4 = &(lp->super_LPRowSetBase<double>).left;
  }
  this->m_lRhs = (pVVar4->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[_i];
  DSVectorBase<double>::DSVectorBase<double>
            (&this->m_row,
             (SVectorBase<double> *)
             ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
             (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[_i].idx));
  Array<double>::Array
            (&this->m_objs,
             (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
             [(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[_i].idx].data.
             super_SVectorBase<double>.memused);
  DataArray<bool>::DataArray(&this->m_fixed,fixCols);
  Array<soplex::DSVectorBase<double>_>::Array
            (&this->m_cols,
             (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
             [(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[_i].idx].data.
             super_SVectorBase<double>.memused);
  this->m_lhsFixed = lhsFixed;
  this->m_maxSense = lp->thesense == MAXIMIZE;
  Array<double>::Array(&this->m_oldLowers,lo);
  Array<double>::Array(&this->m_oldUppers,up);
  this->m_lhs = (lp->super_LPRowSetBase<double>).left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[_i];
  this->m_rhs = (lp->super_LPRowSetBase<double>).right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[_i];
  dVar8 = (lp->super_LPRowSetBase<double>).object.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[_i];
  if (lp->thesense == MINIMIZE) {
    dVar8 = -dVar8;
  }
  this->m_rowobj = dVar8;
  if (0 < (this->m_row).super_SVectorBase<double>.memused) {
    lVar7 = 8;
    lVar6 = 0;
    lVar5 = 0;
    do {
      iVar1 = *(int *)((long)&((this->m_row).super_SVectorBase<double>.m_elem)->val + lVar7);
      (this->m_objs).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5] =
           -(lp->super_LPColSetBase<double>).object.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar1];
      DSVectorBase<double>::operator=
                ((DSVectorBase<double> *)
                 ((long)&((this->m_cols).data.
                          super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_vptr_DSVectorBase + lVar6),
                 (SVectorBase<double> *)
                 ((lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                 (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[iVar1].idx));
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 0x10;
      lVar6 = lVar6 + 0x20;
    } while (lVar5 < (this->m_row).super_SVectorBase<double>.memused);
  }
  return;
}

Assistant:

ForceConstraintPS(const SPxLPBase<R>& lp, int _i, bool lhsFixed,
                        DataArray<bool>& fixCols,
                        Array<R>& lo, Array<R>& up, std::shared_ptr<Tolerances> tols)
         : PostStep("ForceConstraint", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_old_i(lp.nRows() - 1)
         , m_lRhs(lhsFixed ? lp.lhs(_i) : lp.rhs(_i))
         , m_row(lp.rowVector(_i))
         , m_objs(lp.rowVector(_i).size())
         , m_fixed(fixCols)
         , m_cols(lp.rowVector(_i).size())
         , m_lhsFixed(lhsFixed)
         , m_maxSense(lp.spxSense() == SPxLPBase<R>::MAXIMIZE)
         , m_oldLowers(lo)
         , m_oldUppers(up)
         , m_lhs(lp.lhs(_i))
         , m_rhs(lp.rhs(_i))
         , m_rowobj(lp.rowObj(_i))
      {
         for(int k = 0; k < m_row.size(); ++k)
         {
            m_objs[k] = (lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(m_row.index(k)) : -lp.obj(m_row.index(
                            k)));
            m_cols[k] = lp.colVector(m_row.index(k));
         }
      }